

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O1

void __thiscall
ConvexDecomposition::CTri::CTri(CTri *this,float *p1,float *p2,float *p3,uint i1,uint i2,uint i3)

{
  float fVar1;
  
  this->mProcessed = 0;
  this->mI1 = i1;
  this->mI2 = i2;
  this->mI3 = i3;
  (this->mP1).x = *p1;
  (this->mP1).y = p1[1];
  (this->mP1).z = p1[2];
  (this->mP2).x = *p2;
  (this->mP2).y = p2[1];
  (this->mP2).z = p2[2];
  (this->mP3).x = *p3;
  (this->mP3).y = p3[1];
  (this->mP3).z = p3[2];
  fVar1 = Vector3d::ComputePlane(&this->mNormal,&this->mP1,&this->mP2,&this->mP3);
  this->mPlaneD = fVar1;
  return;
}

Assistant:

CTri(const float *p1,const float *p2,const float *p3,unsigned int i1,unsigned int i2,unsigned int i3)
  {
    mProcessed = 0;
    mI1 = i1;
    mI2 = i2;
    mI3 = i3;

  	mP1.Set(p1);
  	mP2.Set(p2);
  	mP3.Set(p3);

  	mPlaneD = mNormal.ComputePlane(mP1,mP2,mP3);
	}